

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::DatabaseInterface::load_blacklist_database(DatabaseInterface *this,char *path)

{
  Impl *pIVar1;
  bool bVar2;
  LogLevel LVar3;
  uint uVar4;
  DatabaseInterface *__p;
  pointer pDVar5;
  char *path_local;
  DatabaseInterface *this_local;
  
  if (this->impl->mode == ReadOnly) {
    bVar2 = std::
            vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
            ::empty(&this->impl->imported_metadata);
    if (bVar2) {
      pIVar1 = this->impl;
      __p = create_stream_archive_database(path,ReadOnly);
      std::
      unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>::
      reset(&pIVar1->blacklist,__p);
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->impl->blacklist);
      if (bVar2) {
        pDVar5 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->(&this->impl->blacklist);
        uVar4 = (*pDVar5->_vptr_DatabaseInterface[2])();
        if ((uVar4 & 1) == 0) {
          std::
          unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
          ::reset(&this->impl->blacklist,(pointer)0x0);
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      LVar3 = get_thread_log_level();
      if (((int)LVar3 < 3) &&
         (bVar2 = Internal::log_thread_callback
                            (LOG_ERROR,"Cannot use imported metadata together with blacklists.\n"),
         !bVar2)) {
        fprintf(_stderr,"Fossilize ERROR: Cannot use imported metadata together with blacklists.\n")
        ;
      }
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DatabaseInterface::load_blacklist_database(const char *path)
{
	if (impl->mode != DatabaseMode::ReadOnly)
		return false;

	if (!impl->imported_metadata.empty())
	{
		LOGE_LEVEL("Cannot use imported metadata together with blacklists.\n");
		return false;
	}

	impl->blacklist.reset(create_stream_archive_database(path, DatabaseMode::ReadOnly));

	if (!impl->blacklist)
		return false;

	if (!impl->blacklist->prepare())
	{
		impl->blacklist.reset();
		return false;
	}

	return true;
}